

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O3

int jpc_poc_getparms(jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in)

{
  jpc_pocpchg_t *ptr;
  int iVar1;
  uint_fast8_t *val;
  int iVar2;
  uint_fast8_t tmp;
  byte local_39;
  jpc_cstate_t *local_38;
  
  iVar1 = 0;
  iVar2 = (int)(ms->len / ((ulong)(0x100 < cstate->numcomps) * 2 + 7));
  (ms->parms).soc = iVar2;
  local_38 = cstate;
  val = (uint_fast8_t *)jas_alloc2((long)iVar2,0x20);
  (ms->parms).sot.len = (uint_fast32_t)val;
  if (val == (uint_fast8_t *)0x0) {
LAB_0011ab29:
    iVar1 = -1;
  }
  else if (0 < (ms->parms).soc) {
    iVar2 = 0;
    do {
      iVar1 = jpc_getuint8(in,val + 1);
      if (iVar1 != 0) {
LAB_0011ab1b:
        ptr = (ms->parms).poc.pchgs;
        if (ptr != (jpc_pocpchg_t *)0x0) {
          jas_free(ptr);
        }
        goto LAB_0011ab29;
      }
      if (local_38->numcomps < 0x101) {
        iVar1 = jpc_getuint8(in,&local_39);
        if (iVar1 == 0) {
          *(ulong *)(val + 8) = (ulong)local_39;
          goto LAB_0011aa7c;
        }
        goto LAB_0011ab1b;
      }
      iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 8));
      if (iVar1 != 0) goto LAB_0011ab1b;
LAB_0011aa7c:
      iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 0x18));
      if (iVar1 != 0) goto LAB_0011ab1b;
      iVar1 = jpc_getuint8(in,val + 2);
      if (iVar1 != 0) goto LAB_0011ab1b;
      if (local_38->numcomps < 0x101) {
        iVar1 = jpc_getuint8(in,&local_39);
        if (iVar1 == 0) {
          *(ulong *)(val + 0x10) = (ulong)local_39;
          goto LAB_0011aae1;
        }
        goto LAB_0011ab1b;
      }
      iVar1 = jpc_getuint16(in,(uint_fast16_t *)(val + 0x10));
      if (iVar1 != 0) goto LAB_0011ab1b;
LAB_0011aae1:
      iVar1 = jpc_getuint8(in,val);
      if (((iVar1 != 0) || (val[2] < val[1])) || (*(ulong *)(val + 0x10) < *(ulong *)(val + 8)))
      goto LAB_0011ab1b;
      iVar2 = iVar2 + 1;
      val = val + 0x20;
    } while (iVar2 < (ms->parms).soc);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int jpc_poc_getparms(jpc_ms_t *ms, jpc_cstate_t *cstate, jas_stream_t *in)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	uint_fast8_t tmp;
	poc->numpchgs = (cstate->numcomps > 256) ? (ms->len / 9) :
	  (ms->len / 7);
	if (!(poc->pchgs = jas_alloc2(poc->numpchgs, sizeof(jpc_pocpchg_t)))) {
		goto error;
	}
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs; ++pchgno,
	  ++pchg) {
		if (jpc_getuint8(in, &pchg->rlvlnostart)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnostart)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			};
			pchg->compnostart = tmp;
		}
		if (jpc_getuint16(in, &pchg->lyrnoend) ||
		  jpc_getuint8(in, &pchg->rlvlnoend)) {
			goto error;
		}
		if (cstate->numcomps > 256) {
			if (jpc_getuint16(in, &pchg->compnoend)) {
				goto error;
			}
		} else {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			}
			pchg->compnoend = tmp;
		}
		if (jpc_getuint8(in, &pchg->prgord)) {
			goto error;
		}
		if (pchg->rlvlnostart > pchg->rlvlnoend ||
		  pchg->compnostart > pchg->compnoend) {
			goto error;
		}
	}
	return 0;

error:
	jpc_poc_destroyparms(ms);
	return -1;
}